

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl-blob-type.cpp
# Opt level: O2

void __thiscall
yactfr::DynamicLengthBlobType::DynamicLengthBlobType
          (DynamicLengthBlobType *this,uint align,DataLocation *lenLoc,Up *attrs)

{
  allocator local_41;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_40;
  string local_38;
  
  local_40._M_head_impl =
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  std::__cxx11::string::string((string *)&local_38,"application/octet-stream",&local_41);
  BlobType::BlobType(&this->super_BlobType,_kindDlBlob,align,(Up *)&local_40,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_40);
  (this->super_BlobType).super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)&PTR__DynamicLengthBlobType_00369b40;
  DataLocation::DataLocation(&this->_lenLoc,lenLoc);
  (this->_theLenTypes)._M_h._M_buckets = &(this->_theLenTypes)._M_h._M_single_bucket;
  (this->_theLenTypes)._M_h._M_bucket_count = 1;
  (this->_theLenTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_theLenTypes)._M_h._M_element_count = 0;
  (this->_theLenTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_theLenTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_theLenTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

DynamicLengthBlobType::DynamicLengthBlobType(const unsigned int align, DataLocation lenLoc,
                                             MapItem::Up attrs) :
    BlobType {_kindDlBlob, align, std::move(attrs)},
    _lenLoc {std::move(lenLoc)}
{
}